

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

void Abc_SopToTruthBig(char *pSop,int nInputs,word **pVars,word *pCube,word *pRes)

{
  char cVar1;
  word *pwVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  iVar4 = 0;
  for (pcVar7 = pSop; *pcVar7 != '\n'; pcVar7 = pcVar7 + 1) {
    if (*pcVar7 == '\0') goto LAB_001f02ae;
    iVar4 = iVar4 + -1;
  }
  uVar3 = 1 << (-(char)iVar4 - 8U & 0x1f);
  if ((int)(-iVar4 - 2U) < 7) {
    uVar3 = 1;
  }
  if (-iVar4 - 2U < 0x11) {
    if (iVar4 + nInputs != -2) {
      __assert_fail("nVars == nInputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                    ,0x500,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
    }
    uVar10 = (ulong)uVar3;
    if (0 < (int)uVar3) {
      memset(pRes,0,uVar10 * 8);
    }
    lVar9 = 0;
    do {
      if (0 < (int)uVar3) {
        memset(pCube,0xff,uVar10 * 8);
      }
      if (nInputs != 0) {
        lVar9 = (long)(int)lVar9;
        uVar5 = 0;
        do {
          cVar1 = pSop[lVar9];
          if (cVar1 != '-') {
            if (cVar1 == '1') {
              if (0 < (int)uVar3) {
                pwVar2 = pVars[uVar5];
                uVar8 = 0;
                do {
                  pCube[uVar8] = pCube[uVar8] & pwVar2[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar10 != uVar8);
              }
            }
            else {
              if (cVar1 != '0') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                              ,0x513,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)")
                ;
              }
              if (0 < (int)uVar3) {
                pwVar2 = pVars[uVar5];
                uVar8 = 0;
                do {
                  pCube[uVar8] = pCube[uVar8] & ~pwVar2[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar10 != uVar8);
              }
            }
          }
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + 1;
        } while (uVar5 < (uint)nInputs);
      }
      if (0 < (int)uVar3) {
        uVar5 = 0;
        do {
          pRes[uVar5] = pRes[uVar5] | pCube[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
      }
      lVar6 = (long)(int)lVar9;
      if (pSop[lVar6] != ' ') {
        __assert_fail("pSop[lit] == \' \'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x517,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
      }
      if (pSop[lVar6 + 2] != '\n') {
        __assert_fail("pSop[lit] == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x51a,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
      }
      lVar9 = lVar6 + 3;
    } while (pSop[lVar6 + 3] != '\0');
    iVar4 = Abc_SopIsComplement(pSop);
    if ((iVar4 != 0) && (0 < (int)uVar3)) {
      uVar5 = 0;
      do {
        pRes[uVar5] = ~pRes[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar5);
    }
    return;
  }
LAB_001f02ae:
  __assert_fail("nVars >= 0 && nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                ,0x4ff,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
}

Assistant:

void Abc_SopToTruthBig( char * pSop, int nInputs, word ** pVars, word * pCube, word * pRes )
{
    int nVars = Abc_SopGetVarNum(pSop);
    int nWords = nVars <= 6 ? 1 : 1 << (nVars-6);
    int v, i, lit = 0;
    assert( nVars >= 0 && nVars <= 16 );
    assert( nVars == nInputs );
    for ( i = 0; i < nWords; i++ )
        pRes[i] = 0;
    do {
        for ( i = 0; i < nWords; i++ )
            pCube[i] = ~(word)0;
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= pVars[v][i];
            }
            else if ( pSop[lit] == '0' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= ~pVars[v][i];
            }
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        for ( i = 0; i < nWords; i++ )
            pRes[i] |= pCube[i];
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
    {
        for ( i = 0; i < nWords; i++ )
            pRes[i] = ~pRes[i];
    }
}